

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O1

void Tas_ManCancelUntil(Tas_Man_t *p,int iBound)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  long lVar3;
  
  if ((p->pProp).iTail < iBound) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                  ,0x277,"void Tas_ManCancelUntil(Tas_Man_t *, int)");
  }
  (p->pProp).iHead = iBound;
  if (iBound < (p->pProp).iTail) {
    lVar3 = (long)iBound;
    do {
      pGVar2 = (p->pProp).pData[lVar3];
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)pGVar2 >> 0x1e & 1) == 0) {
        __assert_fail("pVar->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                      ,0x77,"void Tas_VarUnassign(Gia_Obj_t *)");
      }
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xbfffffffbfffffff;
      pGVar2->Value = 0xffffffff;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->pProp).iTail);
  }
  (p->pProp).iTail = iBound;
  iVar1 = p->vLevReas->nSize;
  if (SBORROW4(iVar1,iBound * 3) == iVar1 + iBound * -3 < 0) {
    p->vLevReas->nSize = iBound * 3;
    return;
  }
  __assert_fail("p->nSize >= nSizeNew",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
}

Assistant:

static inline void Tas_ManCancelUntil( Tas_Man_t * p, int iBound )
{
    Gia_Obj_t * pVar;
    int i;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Tas_QueForEachEntry( p->pProp, pVar, i )
        Tas_VarUnassign( pVar );
    p->pProp.iTail = iBound;
    Vec_IntShrink( p->vLevReas, 3*iBound );
}